

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_encode.c
# Opt level: O0

int SubFrameParamsInit(SubFrameParams *params,int should_try,int empty_rect_allowed)

{
  int iVar1;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined4 *in_RDI;
  
  *in_RDI = in_ESI;
  in_RDI[1] = in_EDX;
  iVar1 = WebPPictureInit((WebPPicture *)0x1a2084);
  if ((iVar1 != 0) && (iVar1 = WebPPictureInit((WebPPicture *)0x1a209a), iVar1 != 0)) {
    return 1;
  }
  return 0;
}

Assistant:

static int SubFrameParamsInit(SubFrameParams* const params,
                              int should_try, int empty_rect_allowed) {
  params->should_try_ = should_try;
  params->empty_rect_allowed_ = empty_rect_allowed;
  if (!WebPPictureInit(&params->sub_frame_ll_) ||
      !WebPPictureInit(&params->sub_frame_lossy_)) {
    return 0;
  }
  return 1;
}